

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::Double(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
         *this,Context *context,double d)

{
  bool bVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  double d_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->type_ & 0x20) == 0) {
    pVVar2 = GetNumberString();
    DisallowedType(this,context,pVVar2);
    context->invalidCode = kValidateErrorType;
    pVVar2 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    context->invalidKeyword = pCVar3;
    this_local._7_1_ = false;
  }
  else {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->minimum_);
    if ((!bVar1) && (bVar1 = CheckDoubleMinimum(this,context,d), !bVar1)) {
      return false;
    }
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->maximum_);
    if ((!bVar1) && (bVar1 = CheckDoubleMaximum(this,context,d), !bVar1)) {
      return false;
    }
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->multipleOf_)
    ;
    if ((!bVar1) && (bVar1 = CheckDoubleMultipleOf(this,context,d), !bVar1)) {
      return false;
    }
    this_local._7_1_ = CreateParallelValidator(this,context);
  }
  return this_local._7_1_;
}

Assistant:

bool Double(Context& context, double d) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::Double", d);
        if (!(type_ & (1 << kNumberSchemaType))) {
            DisallowedType(context, GetNumberString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull() && !CheckDoubleMinimum(context, d))
            return false;

        if (!maximum_.IsNull() && !CheckDoubleMaximum(context, d))
            return false;

        if (!multipleOf_.IsNull() && !CheckDoubleMultipleOf(context, d))
            return false;

        return CreateParallelValidator(context);
    }